

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O3

XSIDCDefinition * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,IdentityConstraint *ic,XSModel *xsModel)

{
  short *psVar1;
  XMLSize_t maxElems;
  XMLCh *__src;
  XMLSize_t XVar2;
  int iVar3;
  XSIDCDefinition *this_00;
  BaseRefVectorOf<char16_t> *this_01;
  IC_Field *pIVar4;
  undefined4 extraout_var;
  XSIDCDefinition *keyIC;
  XSAnnotation *headAnnot;
  size_t __n;
  XMLSize_t i;
  XMLSize_t getAt;
  XSObjectFactory *this_02;
  char16_t *__dest;
  
  this_00 = (XSIDCDefinition *)XSModel::getXSObject(xsModel,ic);
  if (this_00 == (XSIDCDefinition *)0x0) {
    if ((ic->fFields == (RefVectorOf<xercesc_4_0::IC_Field> *)0x0) ||
       (maxElems = (ic->fFields->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fCurCount,
       maxElems == 0)) {
      this_01 = (BaseRefVectorOf<char16_t> *)0x0;
    }
    else {
      this_01 = (BaseRefVectorOf<char16_t> *)XMemory::operator_new(0x30,this->fMemoryManager);
      BaseRefVectorOf<char16_t>::BaseRefVectorOf(this_01,maxElems,true,this->fMemoryManager);
      this_01->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefArrayVectorOf_00401248;
      getAt = 0;
      do {
        pIVar4 = BaseRefVectorOf<xercesc_4_0::IC_Field>::elementAt
                           (&ic->fFields->super_BaseRefVectorOf<xercesc_4_0::IC_Field>,getAt);
        __src = pIVar4->fXPath->fExpression;
        if (__src == (XMLCh *)0x0) {
          __dest = (char16_t *)0x0;
        }
        else {
          __n = 0;
          do {
            psVar1 = (short *)((long)__src + __n);
            __n = __n + 2;
          } while (*psVar1 != 0);
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
          __dest = (char16_t *)CONCAT44(extraout_var,iVar3);
          memcpy(__dest,__src,__n);
        }
        BaseRefVectorOf<char16_t>::ensureExtraCapacity(this_01,1);
        XVar2 = this_01->fCurCount;
        this_01->fElemList[XVar2] = __dest;
        this_01->fCurCount = XVar2 + 1;
        getAt = getAt + 1;
      } while (getAt != maxElems);
    }
    iVar3 = (*(ic->super_XSerializable)._vptr_XSerializable[5])(ic);
    if ((short)iVar3 == 2) {
      keyIC = addOrFind(this,(IdentityConstraint *)ic[1].super_XSerializable._vptr_XSerializable,
                        xsModel);
    }
    else {
      keyIC = (XSIDCDefinition *)0x0;
    }
    this_02 = (XSObjectFactory *)0x48;
    this_00 = (XSIDCDefinition *)XMemory::operator_new(0x48,this->fMemoryManager);
    headAnnot = getAnnotationFromModel(this_02,xsModel,ic);
    XSIDCDefinition::XSIDCDefinition
              (this_00,ic,keyIC,headAnnot,(StringList *)this_01,xsModel,this->fMemoryManager);
    putObjectInMap(this,ic,(XSObject *)this_00);
  }
  return this_00;
}

Assistant:

XSIDCDefinition* XSObjectFactory::addOrFind(IdentityConstraint* const ic,
                                            XSModel* const xsModel)
{
    XSIDCDefinition* xsObj = (XSIDCDefinition*) xsModel->getXSObject(ic);
    if (!xsObj)
    {
        XSIDCDefinition* keyIC = 0;
        StringList*      stringList = 0;
        XMLSize_t        fieldCount = ic->getFieldCount();

        if (fieldCount)
        {
            stringList = new (fMemoryManager) RefArrayVectorOf<XMLCh>(
                fieldCount, true, fMemoryManager);

            for(XMLSize_t i=0; i<fieldCount; i++)
            {
                XMLCh* expr = XMLString::replicate
                (
                    ic->getFieldAt(i)->getXPath()->getExpression()
                    , fMemoryManager
                );
                stringList->addElement(expr);
            }
        }

        if (ic->getType() == IdentityConstraint::ICType_KEYREF)
            keyIC = addOrFind(((IC_KeyRef*) ic)->getKey(), xsModel);

        xsObj= new (fMemoryManager) XSIDCDefinition
        (
            ic
            , keyIC
            , getAnnotationFromModel(xsModel, ic)
            , stringList
            , xsModel
            , fMemoryManager
        );
        putObjectInMap(ic, xsObj);
    }

    return xsObj;
}